

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

Sbd_Sto_t *
Sbd_StoAlloc(Gia_Man_t *pGia,Vec_Int_t *vMirrors,int nLutSize,int nCutSize,int nCutNum,int fCutMin,
            int fVerbose)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  Sbd_Sto_t *pSVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wec_t *pVVar6;
  word *pEntry;
  Vec_Mem_t *p;
  abctime aVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  timespec ts;
  timespec local_40;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29e,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29f,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (8 < nCutSize - 2U) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a0,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0x1f2 < nCutNum - 2U) {
    __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a1,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  pSVar3 = (Sbd_Sto_t *)calloc(1,0x187f8);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    aVar7 = -1;
  }
  else {
    aVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pSVar3->clkStart = aVar7;
  pSVar3->nLutSize = nLutSize;
  pSVar3->nCutSize = nCutSize;
  pSVar3->nCutNum = nCutNum;
  pSVar3->fCutMin = fCutMin;
  pSVar3->fVerbose = fVerbose;
  pSVar3->pGia = pGia;
  pSVar3->vMirrors = vMirrors;
  iVar1 = pGia->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  lVar11 = (long)iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar11 * 4);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)iVar1 * 4);
  }
  pSVar3->vDelays = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar11 * 4);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)iVar1 << 2);
  }
  pSVar3->vLevels = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar11 << 2);
  }
  pVVar4->pArray = piVar5;
  pSVar3->vRefs = pVVar4;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar6->pArray = pVVar4;
  pVVar6->nSize = iVar1;
  pSVar3->vCuts = pVVar6;
  if (fCutMin == 0) {
    p = (Vec_Mem_t *)0x0;
  }
  else {
    uVar9 = 1 << ((char)nCutSize - 6U & 0x1f);
    if (nCutSize < 7) {
      uVar9 = 1;
    }
    __size = (ulong)uVar9 * 8;
    pEntry = (word *)malloc(__size);
    p = (Vec_Mem_t *)calloc(1,0x30);
    p->nEntrySize = uVar9;
    p->LogPageSze = 0xc;
    p->PageMask = 0xfff;
    p->iPage = -1;
    if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
      __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
    }
    uVar9 = 9999;
    while( true ) {
      do {
        uVar8 = uVar9;
        uVar9 = uVar8 + 1;
      } while ((uVar8 & 1) != 0);
      if (uVar9 < 9) break;
      iVar1 = 5;
      while( true ) {
        if (uVar9 % (iVar1 - 2U) == 0) break;
        uVar2 = iVar1 * iVar1;
        iVar1 = iVar1 + 2;
        if (uVar9 < uVar2) goto LAB_005417ab;
      }
    }
LAB_005417ab:
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0xe < uVar8) {
      uVar2 = uVar9;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = uVar2;
    piVar5 = (int *)malloc((long)(int)uVar2 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = uVar9;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0xff,(long)(int)uVar9 << 2);
    }
    p->vTable = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 10000;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(40000);
    pVVar4->pArray = piVar5;
    p->vNexts = pVVar4;
    memset(pEntry,0,__size);
    iVar1 = Vec_MemHashInsert(p,pEntry);
    if (iVar1 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    memset(pEntry,0xaa,__size);
    iVar1 = Vec_MemHashInsert(p,pEntry);
    if (iVar1 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    if (pEntry != (word *)0x0) {
      free(pEntry);
    }
  }
  pSVar3->vTtMem = p;
  return pSVar3;
}

Assistant:

Sbd_Sto_t * Sbd_StoAlloc( Gia_Man_t * pGia, Vec_Int_t * vMirrors, int nLutSize, int nCutSize, int nCutNum, int fCutMin, int fVerbose )
{
    Sbd_Sto_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Sto_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fCutMin  = fCutMin;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vDelays  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vLevels  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vRefs    = Vec_IntAlloc( Gia_ManObjNum(pGia) );
    p->vCuts    = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vTtMem   = fCutMin ? Vec_MemAllocForTT( nCutSize, 0 ) : NULL;
    return p;
}